

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuickprof.cpp
# Opt level: O3

CProfileNode * __thiscall CProfileNode::Get_Sub_Node(CProfileNode *this,char *name)

{
  CProfileNode *pCVar1;
  
  pCVar1 = this->Child;
  while( true ) {
    if (pCVar1 == (CProfileNode *)0x0) {
      pCVar1 = (CProfileNode *)operator_new(0x40);
      pCVar1->Name = name;
      pCVar1->TotalCalls = 0;
      pCVar1->TotalTime = 0.0;
      pCVar1->StartTime = 0;
      pCVar1->RecursionCounter = 0;
      pCVar1->Parent = this;
      pCVar1->Child = (CProfileNode *)0x0;
      pCVar1->Sibling = (CProfileNode *)0x0;
      pCVar1->m_userPtr = (void *)0x0;
      Reset(pCVar1);
      pCVar1->Sibling = this->Child;
      this->Child = pCVar1;
      return pCVar1;
    }
    if (pCVar1->Name == name) break;
    pCVar1 = pCVar1->Sibling;
  }
  return pCVar1;
}

Assistant:

CProfileNode * CProfileNode::Get_Sub_Node( const char * name )
{
	// Try to find this sub node
	CProfileNode * child = Child;
	while ( child ) {
		if ( child->Name == name ) {
			return child;
		}
		child = child->Sibling;
	}

	// We didn't find it, so add it

	CProfileNode * node = new CProfileNode( name, this );
	node->Sibling = Child;
	Child = node;
	return node;
}